

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<float> * __thiscall
TPZFMatrix<float>::operator=(TPZFMatrix<float> *this,TPZFMatrix<float> *A)

{
  float *pfVar1;
  int64_t iVar2;
  float *__dest;
  ulong uVar3;
  
  if (this == A) {
    return this;
  }
  uVar3 = (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
          (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (this->fSize < (long)uVar3) {
    if (uVar3 - (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol *
                (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow != 0) {
      __dest = (float *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
      goto LAB_00bd7d94;
    }
    if (this->fSize < (long)uVar3) {
      __dest = this->fElem;
      goto LAB_00bd7d94;
    }
  }
  __dest = this->fGiven;
LAB_00bd7d94:
  if ((0 < (long)uVar3) && (__dest == (float *)0x0)) {
    Error("Operator= <memory allocation error>.",(char *)0x0);
  }
  pfVar1 = this->fElem;
  if (((pfVar1 != (float *)0x0) && (pfVar1 != __dest)) && (pfVar1 != this->fGiven)) {
    operator_delete__(pfVar1);
  }
  iVar2 = (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = iVar2;
  this->fElem = __dest;
  memcpy(__dest,A->fElem,uVar3 * 4);
  TPZMatrix<float>::operator=(&this->super_TPZMatrix<float>,&A->super_TPZMatrix<float>);
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZFMatrix<TVar> &A ) {
    if(this == &A) return *this;
    int64_t size = A.fRow * A.fCol;
    
    TVar * newElem = fElem;
    if(fSize < size && size != this->fRow*this->fCol) {
        newElem = new TVar
        [size] ;
    } else if (fSize >= size) {
        newElem = fGiven;
    }
    
    if ( newElem == NULL && size > 0) Error( "Operator= <memory allocation error>." );
    if (fElem && fElem != newElem && fElem != fGiven) delete[]( fElem );
    this->fRow  = A.fRow;
    this->fCol  = A.fCol;
    fElem = newElem;
    
    // Copia a matriz
    memcpy((void *)(fElem),(void *)(A.fElem),(size_t)size*sizeof(TVar));
    
    TPZMatrix<TVar>::operator=(A);
    
    
    return *this;
}